

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O3

string * __thiscall
onmt::unicode::cp_to_utf8_abi_cxx11_(string *__return_storage_ptr__,unicode *this,code_point_t uc)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint8_t s [4];
  byte local_c [4];
  
  pbVar2 = &stack0xfffffffffffffff8;
  uVar3 = (uint)this;
  if (uVar3 < 0x80) {
    pbVar2 = local_c + 1;
  }
  else {
    if (uVar3 < 0x800) {
      pbVar2 = local_c + 2;
      bVar1 = (byte)((ulong)this >> 6) | 0xc0;
    }
    else {
      if (uVar3 < 0xd800 || (uVar3 & 0xffffe000) == 0xe000) {
        pbVar2 = local_c + 3;
        bVar1 = (byte)((ulong)this >> 0xc) | 0xe0;
      }
      else {
        if (0xfffff < uVar3 - 0x10000) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          return __return_storage_ptr__;
        }
        local_c[0] = (byte)((ulong)this >> 0x12) | 0xf0;
        bVar1 = (byte)((ulong)this >> 0xc) & 0x3f | 0x80;
      }
      pbVar2[-3] = bVar1;
      bVar1 = (byte)((ulong)this >> 6) & 0x3f | 0x80;
    }
    pbVar2[-2] = bVar1;
    this = (unicode *)(ulong)((byte)this & 0x3f | 0x80);
  }
  pbVar2[-1] = (byte)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_c);
  return __return_storage_ptr__;
}

Assistant:

std::string cp_to_utf8(code_point_t uc)
    {
      uint8_t s[U8_MAX_LENGTH];
      int32_t offset = 0;
      UBool error = false;
      U8_APPEND(s, offset, U8_MAX_LENGTH, uc, error);
      if (error)
        return std::string();
      return std::string(reinterpret_cast<std::string::value_type*>(s), offset);
    }